

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool __thiscall
dg::pta::PointerAnalysisFSInv::handleUninitialized
          (PointerAnalysisFSInv *this,MemoryMapT *mm,MemoryMapT *pm)

{
  bool bVar1;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *mit;
  iterator __end4;
  iterator __begin4;
  MemoryObject *__range4;
  iterator pmit;
  pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>
  *it;
  iterator __end2;
  iterator __begin2;
  MemoryMapT *__range2;
  bool changed;
  MemoryObject *in_stack_ffffffffffffff58;
  MemoryObject *in_stack_ffffffffffffff60;
  Offset local_88;
  Pointer local_80;
  reference local_70;
  _Self local_68;
  _Self local_60;
  type local_58;
  _Self local_50;
  _Self local_48;
  reference local_40;
  _Self local_38;
  _Self local_30 [2];
  byte local_19;
  
  local_19 = 0;
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       ::begin((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                *)in_stack_ffffffffffffff58);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
              *)in_stack_ffffffffffffff58);
  while (bVar1 = std::operator!=(local_30,&local_38), bVar1) {
    local_40 = std::
               _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                            *)0x1a280d);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::find((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                 *)in_stack_ffffffffffffff58,(key_type *)0x1a2824);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                *)in_stack_ffffffffffffff58);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) {
      local_58 = std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                 ::operator*((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                              *)in_stack_ffffffffffffff60);
      local_60._M_node = (_Base_ptr)MemoryObject::begin(in_stack_ffffffffffffff58);
      local_68._M_node = (_Base_ptr)MemoryObject::end(in_stack_ffffffffffffff58);
      while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
        local_70 = std::
                   _Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
                   operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                              *)0x1a28a6);
        bVar1 = Offset::isUnknown(&local_70->first);
        if (!bVar1) {
          std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::
          operator->((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                      *)0x1a28ce);
          in_stack_ffffffffffffff60 = INVALIDATED;
          Offset::Offset(&local_88,0);
          Pointer::Pointer(&local_80,(PSNode *)in_stack_ffffffffffffff60,local_88);
          bVar1 = MemoryObject::addPointsTo
                            (in_stack_ffffffffffffff60,(Offset *)in_stack_ffffffffffffff58,
                             (Pointer *)0x1a2922);
          local_19 = (local_19 & 1) != 0 || bVar1;
        }
        std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
        operator++((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_> *
                   )in_stack_ffffffffffffff60);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                  *)in_stack_ffffffffffffff60);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool handleUninitialized(MemoryMapT *mm, MemoryMapT *pm) {
        bool changed = false;
        for (auto &it : *mm) {
            auto pmit = pm->find(it.first);
            if (pmit == pm->end()) {
                for (auto &mit : *it.second) {
                    if (mit.first.isUnknown())
                        continue; // FIXME: we are optimistic here...
                    changed |= it.second->addPointsTo(mit.first,
                                                      Pointer{INVALIDATED, 0});
                }
                continue;
            }

            /* check the initialization of memory objects
            auto *pmo = pmit->second.get();
            for (auto &mit : *it.second) {
                if (pmo->find(mit.first) != pmo->end())
                    continue;
                if (mit.first.isUnknown())
                    continue; // FIXME: we are optimistic here...

                changed |= it.second->addPointsTo(mit.first,
                                                  Pointer{INVALIDATED, 0});
            }
            */
        }

        return changed;
    }